

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_null_equal_null_literal(void)

{
  undefined1 local_9d;
  nullable local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  nullable local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  local_4c = null;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_4c);
  local_4d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21,"void equality_suite::compare_null_equal_null_literal()",local_a,&local_4d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98);
  local_9c = null;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_9c);
  local_9d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x22,"void equality_suite::compare_null_equal_null_literal()",local_5e,&local_9d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  return;
}

Assistant:

void compare_null_equal_null_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable() == null, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != null, false);
}